

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void free_master_msg(EVmaster_msg *msg)

{
  int i;
  long lVar1;
  leaf_element *plVar2;
  long lVar3;
  
  if (msg->msg_type == DFGnode_join) {
    free((msg->u).node_join.node_name);
    free((msg->u).node_join.contact_string);
    lVar3 = 8;
    for (lVar1 = 0; plVar2 = (msg->u).node_join.sinks, lVar1 < (msg->u).node_join.sink_count;
        lVar1 = lVar1 + 1) {
      free(*(void **)((long)plVar2 + lVar3 + -8));
      free(*(void **)((long)&plVar2->name + lVar3));
      lVar3 = lVar3 + 0x10;
    }
    free(plVar2);
    lVar3 = 8;
    for (lVar1 = 0; plVar2 = (msg->u).node_join.sources, lVar1 < (msg->u).node_join.source_count;
        lVar1 = lVar1 + 1) {
      free(*(void **)((long)plVar2 + lVar3 + -8));
      free(*(void **)((long)&plVar2->name + lVar3));
      lVar3 = lVar3 + 0x10;
    }
  }
  else {
    if (msg->msg_type != DFGflush_reconfig) goto LAB_00143f1f;
    lVar3 = 8;
    for (lVar1 = 0; plVar2 = (leaf_element *)(msg->u).flush_reconfig.attr_stone_list,
        lVar1 < (msg->u).flush_reconfig.count; lVar1 = lVar1 + 1) {
      free(*(void **)((long)&plVar2->name + lVar3));
      lVar3 = lVar3 + 0x10;
    }
  }
  free(plVar2);
LAB_00143f1f:
  free(msg);
  return;
}

Assistant:

static void
free_master_msg(EVmaster_msg *msg)
{
    switch(msg->msg_type) {
    case DFGnode_join: {
	EVnode_join_ptr in = &msg->u.node_join;
	int i;
	free(in->node_name);
	free(in->contact_string);
	for (i=0; i < in->sink_count; i++) {
	    leaf_element *l = &in->sinks[i];
	    if(l->name) free(l->name);
	    if(l->FMtype) free(l->FMtype);
	}
	free(in->sinks);
	for (i=0; i < in->source_count; i++) {
	    leaf_element *l = &in->sources[i];
	    if (l->name) free(l->name);
	    if (l->FMtype) free(l->FMtype);
	}
	free(in->sources);
	break;
    }
    case DFGflush_reconfig: {
	EVflush_attrs_reconfig_ptr in = &msg->u.flush_reconfig;
	int i;
	for (i=0 ; i < in->count; i++) {
	    free(in->attr_stone_list[i].attr_str);
	}
	free(in->attr_stone_list);
	break;
    }
    case DFGdeploy_ack:
    case DFGshutdown_contrib:
    case DFGconn_shutdown:
    default:
	break;
    }
    free(msg);
}